

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void __thiscall QWhatsThat::paintEvent(QWhatsThat *this,QPaintEvent *param_1)

{
  QWidgetData *pQVar1;
  bool bVar2;
  Representation RVar3;
  QPalette *pQVar4;
  QBrush *pQVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  byte unaff_BPL;
  undefined8 *puVar9;
  undefined8 *puVar10;
  byte bVar11;
  int iVar12;
  long in_FS_OFFSET;
  byte bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  QPainter p;
  PaintContext context;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  QPoint local_a0;
  QPoint local_98;
  int iStack_90;
  int iStack_8c;
  undefined1 local_88 [12];
  int iStack_7c;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  qsizetype local_40;
  long local_38;
  
  plVar6 = QGuiApplicationPrivate::platform_theme;
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              ((QVariant *)local_88,QGuiApplicationPrivate::platform_theme,9);
    unaff_BPL = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)local_88);
  }
  bVar11 = plVar6 != (long *)0x0 & unaff_BPL;
  pQVar1 = (this->super_QWidget).data;
  local_98.xp.m_i = 0;
  local_98.yp.m_i = 0;
  iStack_90 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + -1;
  iStack_8c = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + -1;
  if (bVar11 == 1) {
    iStack_90 = iStack_90 - shadowWidth;
    iStack_8c = iStack_8c - shadowWidth;
  }
  local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_a0,&(this->super_QWidget).super_QPaintDevice);
  pQVar4 = QWidget::palette(&this->super_QWidget);
  pQVar5 = (QBrush *)QPalette::brush((ColorGroup)pQVar4,Dark);
  QPen::QPen((QPen *)local_88,pQVar5,0.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_a0);
  QPen::~QPen((QPen *)local_88);
  pQVar4 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar4,Dark);
  QPainter::setBrush((QBrush *)&local_a0);
  QPainter::drawRects((QRect *)&local_a0,(int)&local_98);
  iVar15 = iStack_90 - (int)local_98.xp.m_i;
  iVar16 = iStack_8c - (int)local_98.yp.m_i;
  pQVar4 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar4,Dark);
  QPainter::setPen((QColor *)&local_a0);
  register0x00001200 = CONCAT44(iVar16 + -1,iVar15 + -1);
  local_88._0_8_ = (PrivateShared *)0x100000001;
  QPainter::drawRects((QRect *)&local_a0,(int)local_88);
  if (bVar11 != 0) {
    iVar14 = iVar16 + 1;
    pQVar4 = QWidget::palette(&this->super_QWidget);
    QPalette::brush((ColorGroup)pQVar4,Dark);
    QPainter::setPen((QColor *)&local_a0);
    iVar12 = iVar15 + 6;
    local_88._4_4_ = 6;
    local_88._0_4_ = iVar12;
    QPainter::drawPoints(&local_a0,(int)local_88);
    local_88._4_4_ = 6;
    local_88._0_4_ = iVar15 + 4;
    iStack_7c = 8;
    local_88._8_4_ = iVar12;
    QPainter::drawLines((QLine *)&local_a0,(int)local_88);
    local_88._4_4_ = 6;
    local_88._0_4_ = iVar15 + 2;
    iStack_7c = 10;
    QPainter::drawLines((QLine *)&local_a0,(int)local_88);
    iVar8 = 7;
    if (7 < iVar14) {
      iVar8 = 7;
      do {
        local_88._4_4_ = iVar8;
        local_88._0_4_ = iVar15 + 1;
        iStack_7c = iVar8 + 5;
        QPainter::drawLines((QLine *)&local_a0,(int)local_88);
        iVar8 = iVar8 + 2;
      } while (iVar8 < iVar14);
    }
    iVar8 = (iVar15 + 1 + iVar14) - iVar8;
    if (6 < iVar8) {
      iVar15 = iVar8;
      do {
        local_88._4_4_ = iVar14;
        local_88._0_4_ = iVar15;
        iStack_7c = iVar16 + 6;
        local_88._8_4_ = iVar15 + 5;
        QPainter::drawLines((QLine *)&local_a0,(int)local_88);
        iVar8 = iVar15 + -2;
        bVar2 = 8 < iVar15;
        iVar15 = iVar8;
      } while (bVar2);
    }
    if (0 < iVar8) {
      iVar15 = iVar8 + 2;
      iVar12 = (iVar14 - iVar8) + 6;
      do {
        local_88._4_4_ = iVar12;
        local_88._0_4_ = 6;
        iStack_7c = iVar16 + 6;
        local_88._8_4_ = iVar15 + 3;
        QPainter::drawLines((QLine *)&local_a0,(int)local_88);
        iVar15 = iVar15 + -2;
        iVar12 = iVar12 + 2;
      } while (2 < iVar15);
    }
  }
  iStack_90 = iStack_90 + 1;
  iStack_8c = iStack_8c + 1;
  pQVar4 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar4,Dark);
  QPainter::setPen((QColor *)&local_a0);
  RVar3.m_i = (int)local_98.yp.m_i;
  local_98.xp.m_i = (int)local_98.xp.m_i + 0xc;
  local_98.yp.m_i = RVar3.m_i + 8;
  iStack_90 = iStack_90 + -0xc;
  iStack_8c = iStack_8c + -8;
  if (this->doc == (QTextDocument *)0x0) {
    QPainter::drawText((QRect *)&local_a0,(int)&local_98,(QString *)0x1421,(QRect *)&this->text);
  }
  else {
    local_88._0_8_ = (undefined8)local_98.xp.m_i;
    register0x00001208 = (undefined8)local_98.yp.m_i;
    QPainter::translate((QPointF *)&local_a0);
    local_b8 = 0;
    _iStack_b0 = CONCAT44(iStack_8c - local_98.yp.m_i,iStack_90 - local_98.xp.m_i);
    QPainter::setClipRect((QRect *)&local_a0,(ClipOperation)&local_b8);
    puVar9 = &DAT_006ddf28;
    puVar10 = (undefined8 *)local_88;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar10 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
    }
    local_88._0_4_ = 0xffffffff;
    pQVar4 = (QPalette *)(local_88 + 8);
    QPalette::QPalette(pQVar4);
    local_50 = (undefined1  [16])0x0;
    local_60 = (undefined1  [16])0x0;
    local_70 = (undefined1  [16])0x0;
    local_40 = 0;
    QPalette::brush((ColorGroup)pQVar4,Dark);
    QPalette::setBrush((ColorGroup)pQVar4,Mid,(QBrush *)0x6);
    plVar6 = (long *)QTextDocument::documentLayout();
    (**(code **)(*plVar6 + 0x60))(plVar6,(QRect *)&local_a0,local_88);
    QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
              ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)local_50);
    QPalette::~QPalette(pQVar4);
  }
  QPainter::~QPainter((QPainter *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::paintEvent(QPaintEvent*)
{
    const bool drawShadow = dropShadow();

    QRect r = rect();
    r.adjust(0, 0, -1, -1);
    if (drawShadow)
        r.adjust(0, 0, -shadowWidth, -shadowWidth);
    QPainter p(this);
    p.setPen(QPen(palette().toolTipText(), 0));
    p.setBrush(palette().toolTipBase());
    p.drawRect(r);
    int w = r.width();
    int h = r.height();
    p.setPen(palette().brush(QPalette::Dark).color());
    p.drawRect(1, 1, w-2, h-2);
    if (drawShadow) {
        p.setPen(palette().shadow().color());
        p.drawPoint(w + 5, 6);
        p.drawLine(w + 3, 6, w + 5, 8);
        p.drawLine(w + 1, 6, w + 5, 10);
        int i;
        for(i=7; i < h; i += 2)
            p.drawLine(w, i, w + 5, i + 5);
        for(i = w - i + h; i > 6; i -= 2)
            p.drawLine(i, h, i + 5, h + 5);
        for(; i > 0 ; i -= 2)
            p.drawLine(6, h + 6 - i, i + 5, h + 5);
    }
    r.adjust(0, 0, 1, 1);
    p.setPen(palette().toolTipText().color());
    r.adjust(hMargin, vMargin, -hMargin, -vMargin);

    if (doc) {
        p.translate(r.x(), r.y());
        QRect rect = r;
        rect.translate(-r.x(), -r.y());
        p.setClipRect(rect);
        QAbstractTextDocumentLayout::PaintContext context;
        context.palette.setBrush(QPalette::Text, context.palette.toolTipText());
        doc->documentLayout()->draw(&p, context);
    }
    else
    {
        p.drawText(r, Qt::AlignLeft | Qt::AlignTop | Qt::TextWordWrap | Qt::TextExpandTabs, text);
    }
}